

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O3

ostream * operator<<(ostream *os,ResultValueType value)

{
  long lVar1;
  char *pcVar2;
  
  switch(value) {
  case NONE:
    pcVar2 = "NONE";
    lVar1 = 4;
    break;
  case FLOAT:
    pcVar2 = "FLOAT";
    lVar1 = 5;
    break;
  case INTEGER:
    pcVar2 = "INTEGER";
    goto LAB_001265d5;
  case COMPLEX:
    pcVar2 = "COMPLEX";
LAB_001265d5:
    lVar1 = 7;
    break;
  default:
    goto switchD_001265b5_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_001265b5_default:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValueType value) {
	switch (value) {
	case ResultValueType::NONE:
		os << "NONE";
		break;
	case ResultValueType::INTEGER:
		os << "INTEGER";
		break;
	case ResultValueType::FLOAT:
		os << "FLOAT";
		break;
	case ResultValueType::COMPLEX:
		os << "COMPLEX";
		break;
	}
	return os;
}